

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppunfix5.h
# Opt level: O0

void __thiscall pointprocess::initAkse(pointprocess *this,int i,double lgd)

{
  ostream *this_00;
  double lgd_local;
  int i_local;
  pointprocess *this_local;
  
  if ((i < this->k) && (((i == 0 || (i == 1)) || (i == 2)))) {
    this->akse[i] = lgd;
    this->s = -1;
    this->sw = -1;
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Akse-nummer er ugyldigt");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void pointprocess :: initAkse ( int i, double lgd )
{
  if ( i < k && (( i==0 ) || ( i==1 ) ||  (i==2 )) )
    akse[i] = lgd;
  else { cout << "Akse-nummer er ugyldigt" << endl; abort(); }

  s = -1;
  sw = -1;

}